

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
skip(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
     *this)

{
  char *pcVar1;
  TokenType TVar2;
  UTF8Reader local_20;
  
  if (this->shouldIgnoreComments == true) {
    skipWhitespaceAndComments(this);
    local_20.data = (this->input).data;
  }
  else {
    UTF8Reader::findEndOfWhitespace(&local_20);
    (this->input).data = local_20.data;
  }
  (this->location).location.data = local_20.data;
  pcVar1 = (this->currentType).text;
  TVar2 = matchNextToken(this);
  (this->currentType).text = TVar2.text;
  return (TokenType)pcVar1;
}

Assistant:

TokenType skip()
    {
        if (shouldIgnoreComments)
            skipWhitespaceAndComments();
        else
            input = input.findEndOfWhitespace();

        location.location = input;
        auto last = currentType;
        currentType = matchNextToken();
        return last;
    }